

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eln.c
# Opt level: O0

LineInfo * el_line(EditLine *el)

{
  LineInfoW *pLVar1;
  LineInfo *pLVar2;
  char *pcVar3;
  size_t sVar4;
  wchar_t *local_38;
  wchar_t *p;
  size_t offset;
  LineInfo *info;
  LineInfoW *winfo;
  EditLine *el_local;
  
  pLVar1 = el_wline(el);
  pLVar2 = &el->el_lgcylinfo;
  if ((el->el_flags & 0x200U) == 0) {
    el->el_flags = el->el_flags | 0x200;
    pcVar3 = ct_encode_string(pLVar1->buffer,&el->el_lgcyconv);
    pLVar2->buffer = pcVar3;
    p = (wchar_t *)0x0;
    for (local_38 = pLVar1->buffer; local_38 < pLVar1->cursor; local_38 = local_38 + 1) {
      sVar4 = ct_enc_width(*local_38);
      p = (wchar_t *)(sVar4 + (long)p);
    }
    (el->el_lgcylinfo).cursor = pLVar2->buffer + (long)p;
    p = (wchar_t *)0x0;
    for (local_38 = pLVar1->buffer; local_38 < pLVar1->lastchar; local_38 = local_38 + 1) {
      sVar4 = ct_enc_width(*local_38);
      p = (wchar_t *)(sVar4 + (long)p);
    }
    (el->el_lgcylinfo).lastchar = pLVar2->buffer + (long)p;
    if ((el->el_chared).c_resizefun != (el_zfunc_t)0x0) {
      (*(el->el_chared).c_resizefun)(el,(el->el_chared).c_resizearg);
    }
    el->el_flags = el->el_flags & 0xfffffdff;
  }
  return pLVar2;
}

Assistant:

const LineInfo *
el_line(EditLine *el)
{
	const LineInfoW *winfo = el_wline(el);
	LineInfo *info = &el->el_lgcylinfo;
	size_t offset;
	const wchar_t *p;

	if (el->el_flags & FROM_ELLINE)
		return info;

	el->el_flags |= FROM_ELLINE;
	info->buffer   = ct_encode_string(winfo->buffer, &el->el_lgcyconv);

	offset = 0;
	for (p = winfo->buffer; p < winfo->cursor; p++)
		offset += ct_enc_width(*p);
	info->cursor = info->buffer + offset;

	offset = 0;
	for (p = winfo->buffer; p < winfo->lastchar; p++)
		offset += ct_enc_width(*p);
	info->lastchar = info->buffer + offset;

	if (el->el_chared.c_resizefun)  
		(*el->el_chared.c_resizefun)(el, el->el_chared.c_resizearg);
	el->el_flags &= ~FROM_ELLINE;

	return info;
}